

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ORForest.cpp
# Opt level: O2

void __thiscall
RandomForest::ORForest<float>::GetRankedGiniImportance
          (ORForest<float> *this,
          shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_featureIndexList,
          shared_ptr<std::vector<double,_std::allocator<double>_>_> *o_giniImportanceList)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  value_type vVar4;
  element_type *peVar5;
  element_type *this_00;
  element_type *this_01;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  pointer piVar9;
  pointer piVar10;
  int i;
  ulong uVar11;
  ulong __n;
  pointer this_02;
  ulong __n_00;
  shared_ptr<std::vector<double,_std::allocator<double>_>_> giniImportanceList;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> featureIndexList;
  element_type *local_40;
  
  std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&featureIndexList.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ,&o_featureIndexList->
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              );
  std::__shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&giniImportanceList.
                super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
               ,&o_giniImportanceList->
                 super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
              );
  this_01 = featureIndexList.
            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  pvVar6 = std::
           vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
           ::at((this->trainData).
                super___shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,0);
  peVar5 = (pvVar6->
           super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  std::vector<int,_std::allocator<int>_>::resize
            (this_01,((long)(peVar5->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(peVar5->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2) - 1);
  this_00 = giniImportanceList.
            super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  pvVar6 = std::
           vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
           ::at((this->trainData).
                super___shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,0);
  peVar5 = (pvVar6->
           super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  std::vector<double,_std::allocator<double>_>::resize
            (this_00,((long)(peVar5->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(peVar5->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2) - 1);
  uVar11 = 0;
  while( true ) {
    piVar9 = ((featureIndexList.
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar10 = ((featureIndexList.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)piVar10 - (long)piVar9 >> 2) <= uVar11) break;
    pvVar7 = std::vector<int,_std::allocator<int>_>::at
                       (featureIndexList.
                        super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,uVar11);
    *pvVar7 = (value_type)uVar11;
    pvVar8 = std::vector<double,_std::allocator<double>_>::at
                       (giniImportanceList.
                        super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,uVar11);
    *pvVar8 = 0.0;
    uVar11 = uVar11 + 1;
  }
  for (this_02 = (this->trees).
                 super__Vector_base<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_02 !=
      (this->trees).
      super__Vector_base<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_02 = this_02 + 1) {
    ODTree<float>::UpdateGiniImportance(this_02);
    uVar11 = 0;
    while( true ) {
      piVar9 = ((featureIndexList.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = ((featureIndexList.
                  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)((long)piVar10 - (long)piVar9 >> 2) <= uVar11) break;
      pvVar8 = std::vector<double,_std::allocator<double>_>::at
                         (giniImportanceList.
                          super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,uVar11);
      dVar1 = *pvVar8;
      ODTree<float>::GetGiniImportance((ODTree<float> *)&stack0xffffffffffffffc0);
      pvVar8 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)local_40,uVar11);
      dVar2 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::at
                         (giniImportanceList.
                          super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,uVar11);
      *pvVar8 = dVar1 + dVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      uVar11 = uVar11 + 1;
    }
  }
  uVar11 = 1;
  __n_00 = 0;
  while (__n_00 < ((long)piVar10 - (long)piVar9 >> 2) - 1U) {
    for (__n = uVar11; __n < (ulong)((long)piVar10 - (long)piVar9 >> 2); __n = __n + 1) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::at
                         (giniImportanceList.
                          super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,__n_00);
      dVar1 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::at
                         (giniImportanceList.
                          super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,__n);
      dVar2 = *pvVar8;
      if (dVar1 < dVar2) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::at
                           (featureIndexList.
                            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,__n_00);
        vVar3 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::at
                           (featureIndexList.
                            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,__n);
        vVar4 = *pvVar7;
        pvVar8 = std::vector<double,_std::allocator<double>_>::at
                           (giniImportanceList.
                            super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,__n_00);
        *pvVar8 = dVar2;
        pvVar8 = std::vector<double,_std::allocator<double>_>::at
                           (giniImportanceList.
                            super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,__n);
        *pvVar8 = dVar1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::at
                           (featureIndexList.
                            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,__n_00);
        *pvVar7 = vVar4;
        pvVar7 = std::vector<int,_std::allocator<int>_>::at
                           (featureIndexList.
                            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,__n);
        *pvVar7 = vVar3;
      }
      piVar9 = ((featureIndexList.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = ((featureIndexList.
                  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    }
    uVar11 = uVar11 + 1;
    __n_00 = __n_00 + 1;
  }
  std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&o_featureIndexList->
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
             ,&featureIndexList.
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>::
  operator=(&o_giniImportanceList->
             super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
            ,&giniImportanceList.
              super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
           );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&giniImportanceList.
              super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&featureIndexList.
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void RandomForest::ORForest<T>::GetRankedGiniImportance( std::shared_ptr<std::vector<int> > * o_featureIndexList,  std::shared_ptr<std::vector<double> > * o_giniImportanceList)
{
    std::shared_ptr<std::vector<int> > featureIndexList=* o_featureIndexList;
    std::shared_ptr<std::vector<double> > giniImportanceList=* o_giniImportanceList;
    featureIndexList->resize(trainData->at(0)->size()-1);
    giniImportanceList->resize(trainData->at(0)->size()-1);
    for(int i=0;i<featureIndexList->size();i++)
    {
        featureIndexList->at(i)=i;
        giniImportanceList->at(i)=0.0;
    }
    for (TreeListIterator tree_iter = trees.begin(); tree_iter != trees.end(); tree_iter++)
    {
        tree_iter->UpdateGiniImportance();
        for(int j=0;j<featureIndexList->size();j++)
        {
            giniImportanceList->at(j) = giniImportanceList->at(j) + tree_iter->GetGiniImportance()->at(j);
        }
    }
    
    // sorting
    for(int i=0;i<featureIndexList->size()-1;i++)
    {
        for(int j=i+1;j<featureIndexList->size();j++)
        {
            double leftValue=giniImportanceList->at(i);
            double rightValue=giniImportanceList->at(j);
            if(leftValue<rightValue)
            {
                int leftIndex=featureIndexList->at(i);
                int rightIndex=featureIndexList->at(j);
                giniImportanceList->at(i)=rightValue;
                giniImportanceList->at(j)=leftValue;
                featureIndexList->at(i)=rightIndex;
                featureIndexList->at(j)=leftIndex;
            }
        }
    }
    
    *o_featureIndexList=featureIndexList;
    *o_giniImportanceList=giniImportanceList;
}